

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O2

Kinematics * __thiscall
stateObservation::kine::Kinematics::setToProductNoAlias
          (Kinematics *__return_storage_ptr__,Kinematics *this,Kinematics *multiplier1,
          Kinematics *multiplier2)

{
  Orientation *this_00;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar1;
  Vector3 *other;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar2;
  CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true> *this_01;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar3;
  CheckedVector3 *this_02;
  Vector3 local_a8;
  Matrix<double,_3,_1,_0,_3,_1> *local_90;
  Vector3 *local_88;
  CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true> *local_78;
  CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true> *local_70;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *local_68;
  CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true> *local_60;
  CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true> *local_58;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *local_50;
  CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true> *local_48;
  CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true> *local_40;
  Matrix<double,_3,_1,_0,_3,_1> *local_38;
  
  if (((multiplier1->orientation).m_.isSet_.b_ == false) &&
     (((multiplier1->orientation).q_.isSet_.b_ & 1U) == 0)) {
    __assert_fail("multiplier1.orientation.isSet() && \"The multiplier 1 orientation is not initialized, the multiplication is not possible.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                  ,0x67d,
                  "Kinematics stateObservation::kine::Kinematics::setToProductNoAlias(const Kinematics &, const Kinematics &)"
                 );
  }
  this_00 = &multiplier1->orientation;
  if ((multiplier2->position).isSet_.b_ == false) {
    if (((multiplier2->orientation).m_.isSet_.b_ == false) &&
       (((multiplier2->orientation).q_.isSet_.b_ & 1U) == 0)) {
      __assert_fail("(multiplier2.position.isSet() || multiplier2.orientation.isSet()) && \"The multiplier 2 kinematics is not initialized, the multiplication is not possible.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                    ,0x680,
                    "Kinematics stateObservation::kine::Kinematics::setToProductNoAlias(const Kinematics &, const Kinematics &)"
                   );
    }
LAB_00177c00:
    (this->position).isSet_.b_ = false;
    (this->linVel).isSet_.b_ = false;
    (this->linAcc).isSet_.b_ = false;
  }
  else {
    if ((multiplier1->position).isSet_.b_ != true) goto LAB_00177c00;
    (this->position).isSet_.b_ = true;
    CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
              (&this->position);
    pMVar1 = &(this->position).v_;
    CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
              (&multiplier2->position);
    Orientation::operator*(&local_a8,this_00,&(multiplier2->position).v_);
    local_90 = pMVar1;
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_90,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a8);
    if ((((multiplier2->linVel).isSet_.b_ == true) && ((multiplier1->linVel).isSet_.b_ == true)) &&
       ((multiplier1->angVel).isSet_.b_ == true)) {
      local_40 = &multiplier1->linVel;
      other = &this->tempVec_;
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                (&multiplier2->linVel);
      Orientation::operator*(&local_a8,this_00,&(multiplier2->linVel).v_);
      local_90 = other;
      Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
                ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_90,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a8);
      local_48 = &this->linVel;
      (this->linVel).isSet_.b_ = true;
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                (local_48);
      pMVar3 = &(this->linVel).v_;
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                (&multiplier1->angVel);
      local_50 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&(multiplier1->angVel).v_;
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_50,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)pMVar1);
      local_90 = pMVar3;
      Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
                ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_90,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a8);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)pMVar3,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other);
      local_70 = (CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true> *)
                 pMVar3;
      if ((((multiplier2->linAcc).isSet_.b_ == true) && ((multiplier1->linAcc).isSet_.b_ == true))
         && ((multiplier1->angAcc).isSet_.b_ == true)) {
        local_58 = &multiplier1->linAcc;
        local_60 = &multiplier1->angAcc;
        local_78 = &this->linAcc;
        (this->linAcc).isSet_.b_ = true;
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (&multiplier2->linAcc);
        Orientation::operator*(&local_a8,this_00,&(multiplier2->linAcc).v_);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (local_78);
        pMVar2 = &(this->linAcc).v_;
        local_90 = pMVar2;
        Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_90,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a8);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (local_60);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&(multiplier1->angAcc).v_,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)pMVar1);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (local_78);
        local_90 = pMVar2;
        local_68 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)pMVar2;
        Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_90,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a8);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (&multiplier1->angVel);
        local_90 = pMVar3;
        local_88 = other;
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
        cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                  (&local_a8,local_50,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)&local_90);
        this_01 = local_78;
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (local_78);
        local_38 = pMVar2;
        Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_38,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a8);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (local_58);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (this_01);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
                  (local_68,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            &(multiplier1->linAcc).v_);
      }
      else {
        (this->linAcc).isSet_.b_ = false;
      }
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                (local_40);
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                (local_48);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_70,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&(multiplier1->linVel).v_);
    }
    else {
      (this->linVel).isSet_.b_ = false;
      (this->linAcc).isSet_.b_ = false;
    }
    CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
              (&multiplier1->position);
    CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
              (&this->position);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)pMVar1,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&(multiplier1->position).v_);
  }
  if (((multiplier2->orientation).m_.isSet_.b_ == false) &&
     (((multiplier2->orientation).q_.isSet_.b_ & 1U) == 0)) {
    (this->orientation).q_.isSet_.b_ = false;
    (this->orientation).m_.isSet_.b_ = false;
  }
  else {
    Orientation::setToProductNoAlias(&this->orientation,this_00,&multiplier2->orientation);
    if (((multiplier2->angVel).isSet_.b_ == true) && ((multiplier1->angVel).isSet_.b_ == true)) {
      (this->angVel).isSet_.b_ = true;
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                (&this->angVel);
      pMVar1 = &(this->angVel).v_;
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                (&multiplier2->angVel);
      Orientation::operator*(&local_a8,this_00,&(multiplier2->angVel).v_);
      local_90 = pMVar1;
      Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
                ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_90,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a8);
      if (((multiplier2->angAcc).isSet_.b_ == true) && ((multiplier1->angAcc).isSet_.b_ == true)) {
        local_70 = &multiplier1->angAcc;
        this_02 = &this->angAcc;
        (this->angAcc).isSet_.b_ = true;
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (&multiplier2->angAcc);
        Orientation::operator*(&local_a8,this_00,&(multiplier2->angAcc).v_);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (this_02);
        pMVar3 = &(this->angAcc).v_;
        local_90 = pMVar3;
        Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_90,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a8);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (&multiplier1->angVel);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&(multiplier1->angVel).v_,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)pMVar1);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (this_02);
        local_90 = pMVar3;
        Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_90,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_a8);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (local_70);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                  (this_02);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)pMVar3,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&(multiplier1->angAcc).v_);
      }
      else {
        (this->angAcc).isSet_.b_ = false;
      }
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                (&multiplier1->angVel);
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::chckitm_check_
                (&this->angVel);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)pMVar1,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&(multiplier1->angVel).v_);
      goto LAB_00177e0f;
    }
  }
  (this->angVel).isSet_.b_ = false;
  (this->angAcc).isSet_.b_ = false;
LAB_00177e0f:
  Kinematics(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

inline Kinematics Kinematics::setToProductNoAlias(const Kinematics & multiplier1, const Kinematics & multiplier2)
{
  BOOST_ASSERT(multiplier1.orientation.isSet()
               && "The multiplier 1 orientation is not initialized, the multiplication is not possible.");

  BOOST_ASSERT((multiplier2.position.isSet() || multiplier2.orientation.isSet())
               && "The multiplier 2 kinematics is not initialized, the multiplication is not possible.");

  if(multiplier2.position.isSet() && multiplier1.position.isSet())
  {
    position.set(true);
    Vector3 & R1p2 = position(); /// reference ( Vector3&  )
    R1p2.noalias() = multiplier1.orientation * multiplier2.position();

    if(multiplier2.linVel.isSet() && multiplier1.linVel.isSet() && multiplier1.angVel.isSet())
    {
      Vector3 & R1p2d = tempVec_; /// reference
      R1p2d.noalias() = multiplier1.orientation * multiplier2.linVel();

      linVel.set(true);
      Vector3 & w1xR1p2 = linVel(); /// reference
      w1xR1p2.noalias() = multiplier1.angVel().cross(R1p2);

      Vector3 & w1xR1p2_R1p2d = w1xR1p2; ///  reference ( =linVel() )
      w1xR1p2_R1p2d += R1p2d;

      if(multiplier2.linAcc.isSet() && multiplier1.linAcc.isSet() && multiplier1.angAcc.isSet())
      {
        linAcc.set(true);
        linAcc().noalias() = multiplier1.orientation * multiplier2.linAcc();
        linAcc().noalias() += multiplier1.angAcc().cross(R1p2);
        linAcc().noalias() += multiplier1.angVel().cross(w1xR1p2_R1p2d + R1p2d);
        linAcc() += multiplier1.linAcc();
      }
      else
      {
        linAcc.reset();
      }

      linVel() += multiplier1.linVel();
    }
    else
    {
      linVel.reset();
      linAcc.reset();
    }

    position() += multiplier1.position();
  }
  else
  {
    position.reset();
    linVel.reset();
    linAcc.reset();
  }

  if(multiplier2.orientation.isSet())
  {
    orientation.setToProductNoAlias(multiplier1.orientation, multiplier2.orientation);

    if(multiplier2.angVel.isSet() && multiplier1.angVel.isSet())
    {
      angVel.set(true);
      Vector3 & R1w2 = angVel(); /// reference
      R1w2.noalias() = multiplier1.orientation * multiplier2.angVel();

      if(multiplier2.angAcc.isSet() && multiplier1.angAcc.isSet())
      {
        angAcc.set(true);
        angAcc().noalias() = multiplier1.orientation * multiplier2.angAcc();
        angAcc().noalias() += multiplier1.angVel().cross(R1w2);
        angAcc() += multiplier1.angAcc();
      }
      else
      {
        angAcc.reset();
      }

      angVel() += multiplier1.angVel();
    }
    else
    {
      angVel.reset();
      angAcc.reset();
    }
  }
  else
  {
    orientation.reset();
    angVel.reset();
    angAcc.reset();
  }

  return *this;
}